

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::TrackEventCategory::operator==
          (TrackEventCategory *this,TrackEventCategory *other)

{
  __type_conflict4 _Var1;
  bool local_19;
  TrackEventCategory *other_local;
  TrackEventCategory *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    _Var1 = ::std::operator==(&this->name_,&other->name_);
    local_19 = false;
    if (_Var1) {
      _Var1 = ::std::operator==(&this->description_,&other->description_);
      local_19 = false;
      if (_Var1) {
        local_19 = ::std::operator==(&this->tags_,&other->tags_);
      }
    }
  }
  return local_19;
}

Assistant:

bool TrackEventCategory::operator==(const TrackEventCategory& other) const {
  return unknown_fields_ == other.unknown_fields_
   && name_ == other.name_
   && description_ == other.description_
   && tags_ == other.tags_;
}